

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameBoard.cpp
# Opt level: O0

void __thiscall GameBoard::printGameStatistics(GameBoard *this)

{
  bool bVar1;
  ostream *poVar2;
  pointer this_00;
  _Self local_28;
  _List_node_base *local_20;
  int local_14;
  GameBoard *pGStack_10;
  int count;
  GameBoard *this_local;
  
  pGStack_10 = this;
  poVar2 = std::operator<<((ostream *)&std::cout,"Playing:");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_14 = 1;
  local_20 = (_List_node_base *)
             std::__cxx11::list<Player,_std::allocator<Player>_>::begin(&this->players);
  (this->it)._M_node = local_20;
  while( true ) {
    local_28._M_node =
         (_List_node_base *)std::__cxx11::list<Player,_std::allocator<Player>_>::end(&this->players)
    ;
    bVar1 = std::operator!=(&this->it,&local_28);
    if (!bVar1) break;
    poVar2 = std::operator<<((ostream *)&std::cout,"Player ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_14);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_00 = std::_List_iterator<Player>::operator->(&this->it);
    Player::PrintPlayerStats(this_00);
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    local_14 = local_14 + 1;
    std::_List_iterator<Player>::operator++(&this->it,0);
  }
  return;
}

Assistant:

void GameBoard::printGameStatistics()                                   //prints all players' stats
{
    cout << "Playing:" << endl << endl;

    int count=1;

    for (it=players.begin(); it!=players.end(); it++)
    {
        cout << "Player " << count << endl;
        it->PrintPlayerStats();
        cout << endl;

        count++;
    }
}